

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void * compact_upto_thread(void *args)

{
  fdb_snapshot_info_t **markers_out;
  fdb_kvs_handle **ptr_handle;
  fdb_status fVar1;
  storage_t *psVar2;
  void *extraout_RAX;
  void *extraout_RAX_00;
  bool walflush;
  uint extraout_EDX;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  fdb_snapshot_info_t **ppfVar7;
  fdb_kvs_info *pfVar8;
  fdb_kvs_handle **ppfVar9;
  fdb_file_handle *pfVar10;
  fdb_kvs_handle *pfVar11;
  int iVar12;
  int iVar13;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  timeval __test_begin;
  fdb_kvs_config fStack_9d0;
  idx_prams_t iStack_9b8;
  checkpoint_t cStack_9a0;
  ulong uStack_570;
  fdb_kvs_info *pfStack_568;
  fdb_kvs_handle **ppfStack_560;
  storage_t *psStack_558;
  ulong uStack_550;
  code *pcStack_548;
  uint uStack_53c;
  undefined1 auStack_538 [32];
  fdb_kvs_config fStack_518;
  timeval tStack_500;
  fdb_kvs_info fStack_4f0;
  idx_prams_t iStack_4c0;
  checkpoint_t cStack_4a8;
  fdb_snapshot_info_t **ppfStack_78;
  undefined1 local_40 [40];
  
  gettimeofday((timeval *)(local_40 + 0x18),(__timezone_ptr_t)0x0);
  fdb_open((fdb_file_handle **)local_40,"e2edb_main",(fdb_config *)args);
  iVar3 = 10;
  markers_out = (fdb_snapshot_info_t **)(local_40 + 8);
  do {
    sleep(1);
    ppfVar7 = markers_out;
    pfVar10 = (fdb_file_handle *)local_40._0_8_;
    fVar1 = fdb_get_all_snap_markers
                      ((fdb_file_handle *)local_40._0_8_,markers_out,(uint64_t *)(local_40 + 0x10));
    uStack_53c = (uint)pfVar10;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      compact_upto_thread();
LAB_00107772:
      compact_upto_thread();
      auStack_538._0_8_ = 0;
      pcStack_548 = (code *)0x1077a4;
      ppfStack_78 = markers_out;
      gettimeofday(&tStack_500,(__timezone_ptr_t)0x0);
      pcStack_548 = (code *)0x1077ae;
      fdb_get_default_kvs_config();
      pcStack_548 = (code *)0x1077b3;
      memleak_start();
      pcStack_548 = (code *)0x1077b8;
      rm_storage_fs();
      pcStack_548 = (code *)0x1077c8;
      gen_index_params(&iStack_4c0);
      pcStack_548 = (code *)0x1077df;
      memset(&cStack_4a8,0,0x430);
      pcStack_548 = (code *)0x107803;
      psVar2 = init_storage((fdb_config *)local_40,(fdb_config *)local_40,&fStack_518,&iStack_4c0,
                            &cStack_4a8,SUB41(extraout_EDX,0));
      pcStack_548 = (code *)0x10781c;
      pthread_create((pthread_t *)(auStack_538 + 8),(pthread_attr_t *)0x0,compact_thread,
                     (fdb_config *)local_40);
      if (0 < (int)uStack_53c) {
        ptr_handle = (fdb_kvs_handle **)(auStack_538 + 0x10);
        do {
          pcStack_548 = (code *)0x10783e;
          load_persons(psVar2);
          uVar5 = 100;
          do {
            pcStack_548 = (code *)0x10784b;
            load_persons(psVar2);
            if ((char)((ulong)ppfVar7 & 0xffffffff) != '\0') {
              pcStack_548 = (code *)0x107857;
              delete_persons(psVar2);
            }
            pcStack_548 = (code *)0x107862;
            e2e_fdb_commit(psVar2->main,SUB41(extraout_EDX,0));
            pfVar11 = psVar2->all_docs;
            pcStack_548 = (code *)0x10786e;
            pfVar8 = &fStack_4f0;
            fVar1 = fdb_get_kvs_info(pfVar11,&fStack_4f0);
            cVar6 = (char)pfVar8;
            iVar3 = (int)pfVar11;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              pcStack_548 = (code *)0x1078f3;
              e2e_async_compact_pattern();
LAB_001078f3:
              pcStack_548 = e2e_kvs_index_pattern;
              e2e_async_compact_pattern();
              uStack_570 = (ulong)ppfVar7 & 0xffffffff;
              pfStack_568 = &fStack_4f0;
              ppfStack_560 = ptr_handle;
              psStack_558 = psVar2;
              uStack_550 = (ulong)extraout_EDX & 0xff;
              pcStack_548 = (code *)uVar5;
              fdb_get_default_kvs_config();
              memleak_start();
              rm_storage_fs();
              gen_index_params(&iStack_9b8);
              iVar12 = 0;
              memset(&cStack_9a0,0,0x430);
              psVar2 = init_storage((fdb_config *)auStack_538,(fdb_config *)auStack_538,&fStack_9d0,
                                    &iStack_9b8,&cStack_9a0,walflush);
              if (0 < iVar3) {
                do {
                  start_checkpoint(psVar2);
                  iVar13 = 100;
                  do {
                    load_persons(psVar2);
                    if (cVar6 != '\0') {
                      delete_persons(psVar2);
                    }
                    verify_db(psVar2);
                    iVar13 = iVar13 + -1;
                  } while (iVar13 != 0);
                  end_checkpoint(psVar2);
                  update_index(psVar2,true);
                  verify_db(psVar2);
                  iVar12 = iVar12 + 1;
                } while (iVar12 != iVar3);
              }
              if (fStack_518.custom_cmp._6_1_ != '\x01') {
                replay(psVar2);
              }
              e2e_fdb_shutdown(psVar2);
              memleak_end();
              return extraout_RAX_00;
            }
            pfVar11 = psVar2->all_docs;
            pcStack_548 = (code *)0x107883;
            ppfVar9 = ptr_handle;
            fVar1 = fdb_snapshot_open(pfVar11,ptr_handle,fStack_4f0.last_seqnum);
            cVar6 = (char)ppfVar9;
            iVar3 = (int)pfVar11;
            if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001078f3;
            pcStack_548 = (code *)0x107894;
            update_index(psVar2,true);
            pcStack_548 = (code *)0x10789c;
            verify_db(psVar2);
            pcStack_548 = (code *)0x1078a6;
            fdb_kvs_close((fdb_kvs_handle *)auStack_538._16_8_);
            uVar4 = (int)uVar5 - 1;
            uVar5 = (ulong)uVar4;
          } while (uVar4 != 0);
          uVar4 = (int)auStack_538._0_8_ + 1;
          auStack_538._0_8_ = ZEXT48(uVar4);
        } while (uVar4 != uStack_53c);
      }
      pcStack_548 = (code *)0x1078cf;
      pthread_join(auStack_538._8_8_,(void **)(auStack_538 + 0x18));
      pcStack_548 = (code *)0x1078d7;
      e2e_fdb_shutdown(psVar2);
      pcStack_548 = (code *)0x1078dc;
      memleak_end();
      return extraout_RAX;
    }
    if (local_40._16_8_ == 0) break;
    ppfVar7 = (fdb_snapshot_info_t **)0x0;
    pfVar10 = (fdb_file_handle *)local_40._0_8_;
    fVar1 = fdb_compact_upto((fdb_file_handle *)local_40._0_8_,(char *)0x0,
                             *(fdb_snapshot_marker_t *)local_40._8_8_);
    uStack_53c = (uint)pfVar10;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00107772;
    fdb_free_snap_markers((fdb_snapshot_info_t *)local_40._8_8_,local_40._16_8_);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  fdb_close((fdb_file_handle *)local_40._0_8_);
  return (void *)0x0;
}

Assistant:

void *compact_upto_thread(void *args) {
    TEST_INIT();

    int i;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_status status;

    fdb_config *fconfig = (fdb_config *)args;
    fdb_file_handle *dbfile;
    fdb_open(&dbfile, E2EDB_MAIN, fconfig);
    for (i = 0; i < 10; ++i) {
        sleep(1);
        status = fdb_get_all_snap_markers(dbfile, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (num_markers == 0) {
            // No need of compaction as file is empty
            break;
        }
        status = fdb_compact_upto(dbfile, NULL, markers[0].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_free_snap_markers(markers, num_markers);
    }
    fdb_close(dbfile);
    return NULL;
}